

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitting_filter.cc
# Opt level: O0

void __thiscall
webrtc::SplittingFilter::Synthesis
          (SplittingFilter *this,IFChannelBuffer *bands,IFChannelBuffer *data)

{
  size_t sVar1;
  size_t sVar2;
  FatalMessage local_4d8;
  unsigned_long local_360;
  size_t local_358;
  string *local_350;
  string *_result_2;
  size_t local_1d0;
  size_t local_1c8;
  string *local_1c0;
  string *_result_1;
  FatalMessage local_1a8;
  size_t local_30;
  string *local_28;
  string *_result;
  IFChannelBuffer *data_local;
  IFChannelBuffer *bands_local;
  SplittingFilter *this_local;
  
  _result = (string *)data;
  data_local = bands;
  bands_local = (IFChannelBuffer *)this;
  local_30 = IFChannelBuffer::num_bands(bands);
  local_28 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       (&this->num_bands_,&local_30,"num_bands_ == bands->num_bands()");
  if (local_28 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/splitting_filter.cc"
               ,0x31,local_28);
    rtc::FatalMessage::stream(&local_1a8);
    rtc::FatalMessage::~FatalMessage(&local_1a8);
  }
  local_1c8 = IFChannelBuffer::num_channels((IFChannelBuffer *)_result);
  local_1d0 = IFChannelBuffer::num_channels(data_local);
  local_1c0 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                        (&local_1c8,&local_1d0,"data->num_channels() == bands->num_channels()");
  if (local_1c0 == (string *)0x0) {
    local_358 = IFChannelBuffer::num_frames((IFChannelBuffer *)_result);
    sVar1 = IFChannelBuffer::num_frames_per_band(data_local);
    sVar2 = IFChannelBuffer::num_bands(data_local);
    local_360 = sVar1 * sVar2;
    local_350 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                          (&local_358,&local_360,
                           "data->num_frames() == bands->num_frames_per_band() * bands->num_bands()"
                          );
    if (local_350 == (string *)0x0) {
      sVar1 = IFChannelBuffer::num_bands(data_local);
      if (sVar1 == 2) {
        TwoBandsSynthesis(this,data_local,(IFChannelBuffer *)_result);
      }
      else {
        sVar1 = IFChannelBuffer::num_bands(data_local);
        if (sVar1 == 3) {
          ThreeBandsSynthesis(this,data_local,(IFChannelBuffer *)_result);
        }
      }
      return;
    }
    rtc::FatalMessage::FatalMessage
              (&local_4d8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/splitting_filter.cc"
               ,0x34,local_350);
    rtc::FatalMessage::stream(&local_4d8);
    rtc::FatalMessage::~FatalMessage(&local_4d8);
  }
  rtc::FatalMessage::FatalMessage
            ((FatalMessage *)&_result_2,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/splitting_filter.cc"
             ,0x32,local_1c0);
  rtc::FatalMessage::stream((FatalMessage *)&_result_2);
  rtc::FatalMessage::~FatalMessage((FatalMessage *)&_result_2);
}

Assistant:

void SplittingFilter::Synthesis(const IFChannelBuffer* bands,
                                IFChannelBuffer* data) {
  RTC_DCHECK_EQ(num_bands_, bands->num_bands());
  RTC_DCHECK_EQ(data->num_channels(), bands->num_channels());
  RTC_DCHECK_EQ(data->num_frames(),
                bands->num_frames_per_band() * bands->num_bands());
  if (bands->num_bands() == 2) {
    TwoBandsSynthesis(bands, data);
  } else if (bands->num_bands() == 3) {
    ThreeBandsSynthesis(bands, data);
  }
}